

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_edit.h
# Opt level: O0

void __thiscall leveldb::FileMetaData::~FileMetaData(FileMetaData *this)

{
  long lVar1;
  InternalKey *in_RDI;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  InternalKey::~InternalKey(in_RDI);
  InternalKey::~InternalKey(in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

FileMetaData() : refs(0), allowed_seeks(1 << 30), file_size(0) {}